

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_equal_real(void)

{
  size_type sVar1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_03;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_04;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_05;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_06;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_07;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_08;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_09;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_10;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_11f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_11d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_11c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_11a8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1180;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1150;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1138;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1120;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_10f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_10d8;
  undefined1 local_10c9;
  basic_variable<std::allocator<char>_> local_10c8;
  int local_1094;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1090;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1088;
  undefined1 local_1028 [77];
  undefined1 local_fdb [2];
  undefined1 local_fd9;
  basic_variable<std::allocator<char>_> local_fd8;
  int local_fa4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_fa0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_f98;
  undefined1 local_f38 [77];
  undefined1 local_eeb [2];
  undefined1 local_ee9;
  basic_variable<std::allocator<char>_> local_ee8;
  int local_eb4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_eb0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_ea8;
  undefined1 local_e48 [77];
  undefined1 local_dfb [2];
  undefined1 local_df9;
  basic_variable<std::allocator<char>_> local_df8;
  int local_dc4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_dc0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_db8;
  undefined1 local_d58 [77];
  undefined1 local_d0b [2];
  undefined1 local_d09;
  basic_variable<std::allocator<char>_> local_d08;
  basic_variable<std::allocator<char>_> local_cd8;
  undefined1 local_c9b [2];
  undefined1 local_c99;
  basic_variable<std::allocator<char>_> local_c98;
  basic_variable<std::allocator<char>_> local_c68;
  undefined1 local_c2b [2];
  undefined1 local_c29;
  basic_variable<std::allocator<char>_> local_c28;
  basic_variable<std::allocator<char>_> local_bf8;
  undefined1 local_bbb [2];
  undefined1 local_bb9;
  basic_variable<std::allocator<char>_> local_bb8;
  basic_variable<std::allocator<char>_> local_b88;
  undefined1 local_b4a [10];
  longdouble big_2;
  longdouble zero_2;
  undefined1 local_b19;
  basic_variable<std::allocator<char>_> local_b18;
  int local_ae4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ae0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_ad8;
  undefined1 local_a78 [77];
  undefined1 local_a2b [2];
  undefined1 local_a29;
  basic_variable<std::allocator<char>_> local_a28;
  int local_9f4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_9f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_9e8;
  undefined1 local_988 [77];
  undefined1 local_93b [2];
  undefined1 local_939;
  basic_variable<std::allocator<char>_> local_938;
  int local_904;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_900;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_8f8;
  undefined1 local_898 [77];
  undefined1 local_84b [2];
  undefined1 local_849;
  basic_variable<std::allocator<char>_> local_848;
  int local_814;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_810;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_808;
  undefined1 local_7a8 [77];
  undefined1 local_75b [2];
  undefined1 local_759;
  basic_variable<std::allocator<char>_> local_758;
  basic_variable<std::allocator<char>_> local_728;
  undefined1 local_6eb [2];
  undefined1 local_6e9;
  basic_variable<std::allocator<char>_> local_6e8;
  basic_variable<std::allocator<char>_> local_6b8;
  undefined1 local_67b [2];
  undefined1 local_679;
  basic_variable<std::allocator<char>_> local_678;
  basic_variable<std::allocator<char>_> local_648;
  undefined1 local_60b [2];
  undefined1 local_609;
  basic_variable<std::allocator<char>_> local_608;
  basic_variable<std::allocator<char>_> local_5d8;
  undefined1 local_5a2 [2];
  double local_5a0;
  double big_1;
  double zero_1;
  basic_variable<std::allocator<char>_> local_588;
  int local_554;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_550;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_548;
  undefined1 local_4e8 [77];
  undefined1 local_49b [2];
  undefined1 local_499;
  basic_variable<std::allocator<char>_> local_498;
  int local_464;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_460;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_458;
  undefined1 local_3f8 [77];
  undefined1 local_3ab [2];
  undefined1 local_3a9;
  basic_variable<std::allocator<char>_> local_3a8;
  int local_374;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_370;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_368;
  undefined1 local_308 [77];
  undefined1 local_2bb [2];
  undefined1 local_2b9;
  basic_variable<std::allocator<char>_> local_2b8;
  int local_284;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_280;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_278;
  undefined1 local_218 [77];
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  float local_10;
  undefined4 local_c;
  float big;
  float zero;
  
  local_c = 0;
  local_10 = std::numeric_limits<float>::max();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_78,0.0);
  local_12[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe1b,"void equality_suite::compare_map_equal_real()",local_12,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_e8,0.0);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe1c,"void equality_suite::compare_map_equal_real()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_158,3.4028235e+38);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe1d,"void equality_suite::compare_map_equal_real()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_1c8,3.4028235e+38);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = '\x01';
  sVar1 = 0xe1e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe1e,"void equality_suite::compare_map_equal_real()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  local_280 = &local_278;
  local_284 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_280,(char (*) [6])"alpha",&local_284);
  local_218._0_8_ = &local_278;
  local_218._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_map<std::allocator<char>_> *)local_218._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_2b8,0.0);
  local_1cb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_2b8);
  local_2b9 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe20,"void equality_suite::compare_map_equal_real()",local_1cb,&local_2b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  ppVar2 = &local_278;
  local_10d8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_218;
  do {
    local_10d8 = local_10d8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_10d8);
  } while (local_10d8 != ppVar2);
  local_370 = &local_368;
  local_374 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_370,(char (*) [6])"alpha",&local_374);
  local_308._0_8_ = &local_368;
  local_308._8_8_ = 1;
  init_00._M_len = (size_type)ppVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10),
             (basic_map<std::allocator<char>_> *)local_308._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_3a8,0.0);
  local_2bb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10),&local_3a8);
  local_3a9 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe21,"void equality_suite::compare_map_equal_real()",local_2bb,&local_3a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10));
  ppVar2 = &local_368;
  local_10f0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_308;
  do {
    local_10f0 = local_10f0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_10f0);
  } while (local_10f0 != ppVar2);
  local_460 = &local_458;
  local_464 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_460,(char (*) [6])"alpha",&local_464);
  local_3f8._0_8_ = &local_458;
  local_3f8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_3f8._0_8_,init_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_498,3.4028235e+38);
  local_3ab[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),&local_498);
  local_499 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe22,"void equality_suite::compare_map_equal_real()",local_3ab,&local_499);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  ppVar2 = &local_458;
  local_1108 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_3f8;
  do {
    local_1108 = local_1108 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1108);
  } while (local_1108 != ppVar2);
  local_550 = &local_548;
  local_554 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_550,(char (*) [6])"alpha",&local_554);
  local_4e8._0_8_ = &local_548;
  local_4e8._8_8_ = 1;
  init_02._M_len = (size_type)ppVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_4e8._0_8_,init_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_588,3.4028235e+38);
  local_49b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10),&local_588);
  zero_1._7_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe23,"void equality_suite::compare_map_equal_real()",local_49b,(long)&zero_1 + 7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10));
  local_1120 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_4e8;
  do {
    local_1120 = local_1120 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1120);
  } while (local_1120 != &local_548);
  big_1 = 0.0;
  local_5a0 = std::numeric_limits<double>::max();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_608,0.0);
  local_5a2[0] = trial::dynamic::operator==(&local_5d8,&local_608);
  local_609 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe29,"void equality_suite::compare_map_equal_real()",local_5a2,&local_609);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_608);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_678,0.0);
  local_60b[0] = trial::dynamic::operator!=(&local_648,&local_678);
  local_679 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe2a,"void equality_suite::compare_map_equal_real()",local_60b,&local_679);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_648);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_6e8,1.79769313486232e+308);
  local_67b[0] = trial::dynamic::operator==(&local_6b8,&local_6e8);
  local_6e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe2b,"void equality_suite::compare_map_equal_real()",local_67b,&local_6e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6b8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_758,1.79769313486232e+308);
  local_6eb[0] = trial::dynamic::operator!=(&local_728,&local_758);
  local_759 = '\x01';
  sVar1 = 0xe2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe2c,"void equality_suite::compare_map_equal_real()",local_6eb,&local_759);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_728);
  local_810 = &local_808;
  local_814 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_810,(char (*) [6])"alpha",&local_814);
  local_7a8._0_8_ = &local_808;
  local_7a8._8_8_ = 1;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_7a8._0_8_,init_03);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_848,0.0);
  local_75b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10),&local_848);
  local_849 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe2e,"void equality_suite::compare_map_equal_real()",local_75b,&local_849);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_848);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10));
  ppVar2 = &local_808;
  local_1138 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_7a8;
  do {
    local_1138 = local_1138 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1138);
  } while (local_1138 != ppVar2);
  local_900 = &local_8f8;
  local_904 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_900,(char (*) [6])"alpha",&local_904);
  local_898._0_8_ = &local_8f8;
  local_898._8_8_ = 1;
  init_04._M_len = (size_type)ppVar2;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10),
             (basic_map<std::allocator<char>_> *)local_898._0_8_,init_04);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_938,0.0);
  local_84b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10),&local_938);
  local_939 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe2f,"void equality_suite::compare_map_equal_real()",local_84b,&local_939);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10));
  ppVar2 = &local_8f8;
  local_1150 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_898;
  do {
    local_1150 = local_1150 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1150);
  } while (local_1150 != ppVar2);
  local_9f0 = &local_9e8;
  local_9f4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_9f0,(char (*) [6])"alpha",&local_9f4);
  local_988._0_8_ = &local_9e8;
  local_988._8_8_ = 1;
  init_05._M_len = (size_type)ppVar2;
  init_05._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10),
             (basic_map<std::allocator<char>_> *)local_988._0_8_,init_05);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_a28,1.79769313486232e+308);
  local_93b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10),&local_a28);
  local_a29 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe30,"void equality_suite::compare_map_equal_real()",local_93b,&local_a29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10));
  ppVar2 = &local_9e8;
  local_1168 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_988;
  do {
    local_1168 = local_1168 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1168);
  } while (local_1168 != ppVar2);
  local_ae0 = &local_ad8;
  local_ae4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_ae0,(char (*) [6])"alpha",&local_ae4);
  local_a78._0_8_ = &local_ad8;
  local_a78._8_8_ = 1;
  init_06._M_len = (size_type)ppVar2;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a78 + 0x10),
             (basic_map<std::allocator<char>_> *)local_a78._0_8_,init_06);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_b18,1.79769313486232e+308);
  local_a2b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_a78 + 0x10),&local_b18);
  local_b19 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe31,"void equality_suite::compare_map_equal_real()",local_a2b,&local_b19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a78 + 0x10));
  local_1180 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_a78;
  do {
    local_1180 = local_1180 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1180);
  } while (local_1180 != &local_ad8);
  unique0x10001afb = (longdouble)0;
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_bb8,(longdouble)0);
  local_b4a[0] = trial::dynamic::operator==(&local_b88,&local_bb8);
  local_bb9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe37,"void equality_suite::compare_map_equal_real()",local_b4a,&local_bb9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_bb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b88);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_c28,(longdouble)0);
  local_bbb[0] = trial::dynamic::operator!=(&local_bf8,&local_c28);
  local_c29 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe38,"void equality_suite::compare_map_equal_real()",local_bbb,&local_c29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_bf8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_c98,_DAT_00223040);
  local_c2b[0] = trial::dynamic::operator==(&local_c68,&local_c98);
  local_c99 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe39,"void equality_suite::compare_map_equal_real()",local_c2b,&local_c99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c68);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_d08,_DAT_00223040);
  local_c9b[0] = trial::dynamic::operator!=(&local_cd8,&local_d08);
  local_d09 = '\x01';
  sVar1 = 0xe3a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe3a,"void equality_suite::compare_map_equal_real()",local_c9b,&local_d09);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d08);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_cd8);
  local_dc0 = &local_db8;
  local_dc4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_dc0,(char (*) [6])"alpha",&local_dc4);
  local_d58._0_8_ = &local_db8;
  local_d58._8_8_ = 1;
  init_07._M_len = sVar1;
  init_07._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_d58 + 0x10),
             (basic_map<std::allocator<char>_> *)local_d58._0_8_,init_07);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_df8,(longdouble)0);
  local_d0b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_d58 + 0x10),&local_df8);
  local_df9 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe3c,"void equality_suite::compare_map_equal_real()",local_d0b,&local_df9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_df8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_d58 + 0x10));
  ppVar2 = &local_db8;
  local_11a8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_d58;
  do {
    local_11a8 = local_11a8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_11a8);
  } while (local_11a8 != ppVar2);
  local_eb0 = &local_ea8;
  local_eb4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_eb0,(char (*) [6])"alpha",&local_eb4);
  local_e48._0_8_ = &local_ea8;
  local_e48._8_8_ = 1;
  init_08._M_len = (size_type)ppVar2;
  init_08._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_e48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_e48._0_8_,init_08);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_ee8,(longdouble)0);
  local_dfb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_e48 + 0x10),&local_ee8);
  local_ee9 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe3d,"void equality_suite::compare_map_equal_real()",local_dfb,&local_ee9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ee8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_e48 + 0x10));
  ppVar2 = &local_ea8;
  local_11c0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_e48;
  do {
    local_11c0 = local_11c0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_11c0);
  } while (local_11c0 != ppVar2);
  local_fa0 = &local_f98;
  local_fa4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_fa0,(char (*) [6])"alpha",&local_fa4);
  local_f38._0_8_ = &local_f98;
  local_f38._8_8_ = 1;
  init_09._M_len = (size_type)ppVar2;
  init_09._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_f38 + 0x10),
             (basic_map<std::allocator<char>_> *)local_f38._0_8_,init_09);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_fd8,_DAT_00223040);
  local_eeb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_f38 + 0x10),&local_fd8);
  local_fd9 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe3e,"void equality_suite::compare_map_equal_real()",local_eeb,&local_fd9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_fd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_f38 + 0x10));
  ppVar2 = &local_f98;
  local_11d8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_f38;
  do {
    local_11d8 = local_11d8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_11d8);
  } while (local_11d8 != ppVar2);
  local_1090 = &local_1088;
  local_1094 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_1090,(char (*) [6])"alpha",&local_1094);
  local_1028._0_8_ = &local_1088;
  local_1028._8_8_ = 1;
  init_10._M_len = (size_type)ppVar2;
  init_10._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1028 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1028._0_8_,init_10);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_10c8,_DAT_00223040);
  local_fdb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_1028 + 0x10),&local_10c8
                           );
  local_10c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe3f,"void equality_suite::compare_map_equal_real()",local_fdb,&local_10c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_10c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1028 + 0x10));
  local_11f0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1028;
  do {
    local_11f0 = local_11f0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_11f0);
  } while (local_11f0 != &local_1088);
  return;
}

Assistant:

void compare_map_equal_real()
{
    {
        const auto zero = 0.0f;
        const auto big = std::numeric_limits<float>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(big), true);
    }
    {
        const auto zero = 0.0;
        const auto big = std::numeric_limits<double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(big), true);
    }
    {
        const auto zero = 0.0L;
        const auto big = std::numeric_limits<long double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(big), true);
    }
}